

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Request * __thiscall
kj::anon_unknown_31::HttpClientImpl::request
          (Request *__return_storage_ptr__,HttpClientImpl *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  bool bVar1;
  ArrayPtr<const_char> word3;
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  undefined8 uVar2;
  _func_int **pp_Var3;
  AsyncInputStream *pAVar4;
  size_t sVar5;
  HttpOutputStream *this_00;
  long lVar6;
  unsigned_long uVar7;
  size_t sVar8;
  AsyncInputStream *pAVar9;
  TransformPromiseNodeBase *pTVar10;
  TransformPromiseNodeBase *this_01;
  unsigned_long *params;
  kj *this_02;
  uint uVar11;
  char *pcVar12;
  long *plVar13;
  ArrayPtr<const_char> word2;
  ArrayPtr<const_char> word1;
  String lengthStr;
  Fault f;
  Disposer *local_138;
  undefined1 local_128 [40];
  TransformPromiseNodeBase *pTStack_100;
  _func_int **local_f8;
  AsyncInputStream *pAStack_f0;
  HttpHeaderTable *local_e8;
  String local_d8;
  RemoveConst<kj::HttpHeaders::Header> *local_c0;
  HttpOutputStream *local_b8;
  ArrayDisposer *local_b0;
  StringPtr local_a8 [5];
  long local_58;
  unsigned_long local_50;
  long local_48;
  unsigned_long local_40 [2];
  
  local_b0 = (ArrayDisposer *)url.content.ptr;
  if (this->upgraded == true) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
              ((Fault *)local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc48,FAILED,"!upgraded",
               "\"can\'t make further requests on this HttpClient because it has been or is in the process \" \"of being upgraded\""
               ,(char (*) [106])
                "can\'t make further requests on this HttpClient because it has been or is in the process of being upgraded"
              );
    _::Debug::Fault::fatal((Fault *)local_a8);
  }
  if (this->closed == true) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[78]>
              ((Fault *)local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc4a,FAILED,"!closed",
               "\"this HttpClient\'s connection has been closed by the server or due to an error\"",
               (char (*) [78])
               "this HttpClient\'s connection has been closed by the server or due to an error");
    _::Debug::Fault::fatal((Fault *)local_a8);
  }
  if ((((this->httpOutput).inBody != false) || ((this->httpOutput).broken != false)) ||
     (((this->httpOutput).writeInProgress & 1U) != 0)) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[75]>
              ((Fault *)local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc4c,FAILED,"httpOutput.canReuse()",
               "\"can\'t start new request until previous request body has been fully written\"",
               (char (*) [75])
               "can\'t start new request until previous request body has been fully written");
    _::Debug::Fault::fatal((Fault *)local_a8);
  }
  params = local_40;
  plVar13 = &local_48;
  if (((this->closeWatcherTask).ptr.isSet == true) &&
     ((this->closeWatcherTask).ptr.isSet = false,
     (this->closeWatcherTask).ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
    (this->closeWatcherTask).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**((this->closeWatcherTask).ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
              ();
  }
  local_b8 = &this->httpOutput;
  lVar6 = 8;
  do {
    *(char **)((long)local_a8 + lVar6 + -8) = "";
    *(undefined8 *)((long)&local_a8[0].content.ptr + lVar6) = 1;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x78);
  local_f8 = (_func_int **)0x0;
  pAStack_f0 = (AsyncInputStream *)0x0;
  local_e8 = (HttpHeaderTable *)0x0;
  bVar1 = (expectedBodySize->ptr).isSet;
  local_c0 = (RemoveConst<kj::HttpHeaders::Header> *)&(expectedBodySize->ptr).field_1;
  this_02 = (kj *)0x0;
  if (bVar1 != false) {
    this_02 = (kj *)local_c0;
  }
  if (bVar1 == true) {
    if ((HEAD < method) || (*(long *)&this_02->field_0x0 != 0)) {
      str<unsigned_long&>((String *)local_128,this_02,params);
      pAVar9 = pAStack_f0;
      pp_Var3 = local_f8;
      if (local_f8 != (_func_int **)0x0) {
        local_f8 = (_func_int **)0x0;
        pAStack_f0 = (AsyncInputStream *)0x0;
        (*(code *)(((local_e8->namesById).builder.ptr)->content).ptr)
                  (local_e8,pp_Var3,1,pAVar9,pAVar9,0);
      }
      local_f8 = (_func_int **)local_128._0_8_;
      pAStack_f0 = (AsyncInputStream *)local_128._8_8_;
      pcVar12 = (char *)(_func_int **)0x385fb3;
      if ((AsyncInputStream *)local_128._8_8_ != (AsyncInputStream *)0x0) {
        pcVar12 = (char *)local_128._0_8_;
      }
      local_e8 = (HttpHeaderTable *)local_128._16_8_;
      uVar7 = (long)(_func_int ***)local_128._8_8_ +
              (ulong)((AsyncInputStream *)local_128._8_8_ == (AsyncInputStream *)0x0);
      params = &local_50;
      plVar13 = &local_58;
LAB_002d8cb3:
      *plVar13 = (long)pcVar12;
      *params = uVar7;
      bVar1 = true;
      goto LAB_002d8cbe;
    }
  }
  else {
    uVar7 = 8;
    pcVar12 = "chunked";
    if ((HEAD < method) || (1 < (headers->indexedHeaders).ptr[6].content.size_)) goto LAB_002d8cb3;
  }
  bVar1 = false;
LAB_002d8cbe:
  local_128._32_8_ = local_a8;
  pTStack_100 = (TransformPromiseNodeBase *)0x7;
  pcVar12 = *(char **)(METHOD_NAMES + (ulong)method * 8);
  sVar8 = strlen(pcVar12);
  local_128._0_8_ = "HTTP/1.1";
  local_128._8_8_ = &DAT_00000008;
  word3.size_ = 8;
  word3.ptr = "HTTP/1.1";
  connectionHeaders.size_ = (size_t)pTStack_100;
  connectionHeaders.ptr = (StringPtr *)local_128._32_8_;
  word2.size_ = url.content.size_ - 1;
  word2.ptr = (char *)local_b0;
  word1.size_ = sVar8;
  word1.ptr = pcVar12;
  HttpHeaders::serialize(&local_d8,headers,word1,word2,word3,connectionHeaders);
  this_00 = local_b8;
  HttpOutputStream::writeHeaders(local_b8,&local_d8);
  sVar5 = local_d8.content.size_;
  pcVar12 = local_d8.content.ptr;
  if (local_d8.content.ptr != (char *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(_func_int **)(((StringPtr *)&(local_d8.content.disposer)->_vptr_ArrayDisposer)->content).ptr
    )(local_d8.content.disposer,pcVar12,1,sVar5,sVar5,0);
  }
  if (bVar1) {
    if ((expectedBodySize->ptr).isSet == true) {
      heap<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&,unsigned_long&>
                ((kj *)local_128,this_00,(unsigned_long *)local_c0);
      local_138 = (Disposer *)local_128._0_8_;
      pAVar9 = (AsyncInputStream *)local_128._8_8_;
    }
    else {
      pAVar9 = (AsyncInputStream *)operator_new(0x10);
      pAVar9->_vptr_AsyncInputStream = (_func_int **)&PTR_write_00460fc8;
      pAVar9[1]._vptr_AsyncInputStream = (_func_int **)this_00;
      local_138 = (Disposer *)
                  &_::HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityWriter>::instance;
    }
  }
  else {
    HttpOutputStream::finishBody(this_00);
    pAVar9 = (AsyncInputStream *)operator_new(8);
    pAVar9->_vptr_AsyncInputStream = (_func_int **)&PTR_write_004608f0;
    local_138 = (Disposer *)
                &_::HeapDisposer<kj::(anonymous_namespace)::HttpNullEntityWriter>::instance;
  }
  uVar11 = this->counter + 1;
  this->counter = uVar11;
  HttpInputStreamImpl::readMessageHeaders((HttpInputStreamImpl *)local_128);
  pTVar10 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar10,(Own<kj::_::PromiseNode> *)local_128,
             _::
             TransformPromiseNode<kj::Maybe<kj::HttpHeaders::Response>,_kj::ArrayPtr<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1162:38),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  uVar2 = local_128._8_8_;
  (pTVar10->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f478;
  pTVar10[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&this->httpInput;
  local_128._32_8_ =
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Maybe<kj::HttpHeaders::Response>,kj::ArrayPtr<char>,kj::(anonymous_namespace)::HttpInputStreamImpl::readResponseHeaders()::{lambda(kj::ArrayPtr<char>)#1},kj::_::PropagateException>>
        ::instance;
  pTStack_100 = pTVar10;
  if ((AsyncInputStream *)local_128._8_8_ != (AsyncInputStream *)0x0) {
    local_128._8_8_ = (AsyncInputStream *)0x0;
    (***(_func_int ***)local_128._0_8_)
              (local_128._0_8_,
               (_func_int *)((long)(_func_int ***)uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
  }
  this_01 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_01,(Own<kj::_::PromiseNode> *)(local_128 + 0x20),
             _::
             TransformPromiseNode<kj::HttpClient::Response,_kj::Maybe<kj::HttpHeaders::Response>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3197:11),_kj::_::PropagateException>
             ::anon_class_16_3_0b5a0f4b_for_func::operator());
  pTVar10 = pTStack_100;
  (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004610d0;
  this_01[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
  *(HttpMethod *)&this_01[1].dependency.disposer = method;
  *(uint *)((long)&this_01[1].dependency.disposer + 4) = uVar11;
  if (pTStack_100 != (TransformPromiseNodeBase *)0x0) {
    pTStack_100 = (TransformPromiseNodeBase *)0x0;
    (***(_func_int ***)local_128._32_8_)
              (local_128._32_8_,
               (_func_int *)
               ((long)&(pTVar10->super_PromiseNode)._vptr_PromiseNode +
               (long)(pTVar10->super_PromiseNode)._vptr_PromiseNode[-2]));
  }
  pAVar4 = pAStack_f0;
  pp_Var3 = local_f8;
  (__return_storage_ptr__->body).disposer = local_138;
  (__return_storage_ptr__->body).ptr = (AsyncOutputStream *)pAVar9;
  (__return_storage_ptr__->response).super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpClient::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpClientImpl::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
        ::instance;
  (__return_storage_ptr__->response).super_PromiseBase.node.ptr = (PromiseNode *)this_01;
  if (local_f8 != (_func_int **)0x0) {
    local_f8 = (_func_int **)0x0;
    pAStack_f0 = (AsyncInputStream *)0x0;
    (*(code *)(((local_e8->namesById).builder.ptr)->content).ptr)
              (local_e8,pp_Var3,1,pAVar4,pAVar4,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
    KJ_REQUIRE(!upgraded,
        "can't make further requests on this HttpClient because it has been or is in the process "
        "of being upgraded");
    KJ_REQUIRE(!closed,
        "this HttpClient's connection has been closed by the server or due to an error");
    KJ_REQUIRE(httpOutput.canReuse(),
        "can't start new request until previous request body has been fully written");
    closeWatcherTask = nullptr;

    kj::StringPtr connectionHeaders[HttpHeaders::CONNECTION_HEADERS_COUNT];
    kj::String lengthStr;

    bool isGet = method == HttpMethod::GET || method == HttpMethod::HEAD;
    bool hasBody;

    KJ_IF_MAYBE(s, expectedBodySize) {
      if (isGet && *s == 0) {
        // GET with empty body; don't send any Content-Length.
        hasBody = false;
      } else {
        lengthStr = kj::str(*s);
        connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = lengthStr;
        hasBody = true;
      }
    } else {
      if (isGet && headers.get(HttpHeaderId::TRANSFER_ENCODING) == nullptr) {
        // GET with empty body; don't send any Transfer-Encoding.
        hasBody = false;
      } else {
        // HACK: Normally GET requests shouldn't have bodies. But, if the caller set a
        //   Transfer-Encoding header on a GET, we use this as a special signal that it might
        //   actually want to send a body. This allows pass-through of a GET request with a chunked
        //   body to "just work". We strongly discourage writing any new code that sends
        //   full-bodied GETs.
        connectionHeaders[HttpHeaders::BuiltinIndices::TRANSFER_ENCODING] = "chunked";
        hasBody = true;
      }
    }

    httpOutput.writeHeaders(headers.serializeRequest(method, url, connectionHeaders));

    kj::Own<kj::AsyncOutputStream> bodyStream;
    if (!hasBody) {
      // No entity-body.
      httpOutput.finishBody();
      bodyStream = heap<HttpNullEntityWriter>();
    } else KJ_IF_MAYBE(s, expectedBodySize) {
      bodyStream = heap<HttpFixedLengthEntityWriter>(httpOutput, *s);
    } else {
      bodyStream = heap<HttpChunkedEntityWriter>(httpOutput);
    }